

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,StringPiece message_name,
          StringPiece type_url_prefix)

{
  AlphaNum local_98;
  long local_68;
  char *local_60;
  AlphaNum local_38;
  
  local_60 = type_url_prefix.ptr_;
  local_68 = message_name.length_;
  local_38.piece_size_ = (size_t)message_name.ptr_;
  if ((local_60 == (char *)0x0) || (local_60[local_68 + -1] != '/')) {
    local_98.piece_data_ = "/";
    local_98.piece_size_ = 1;
    local_38.piece_data_ = (char *)this;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_68,&local_98,&local_38,&local_98);
  }
  else {
    local_98.piece_data_ = (char *)this;
    local_98.piece_size_ = local_38.piece_size_;
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_68,&local_98,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(StringPiece message_name,
                       StringPiece type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return StrCat(type_url_prefix, message_name);
  } else {
    return StrCat(type_url_prefix, "/", message_name);
  }
}